

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O2

void greetable_proxy_init(GreetableProxy *proxy)

{
  undefined8 uVar1;
  
  proxy->priv = (GreetableProxyPrivate *)
                ((long)&(proxy->parent_instance).parent_instance.g_type_instance.g_class +
                (long)GreetableProxy_private_offset);
  uVar1 = g_dbus_proxy_get_type();
  uVar1 = g_type_check_instance_cast(proxy,uVar1);
  g_dbus_proxy_set_interface_info(uVar1,&_greetable_interface_info);
  return;
}

Assistant:

static void
greetable_proxy_init (GreetableProxy *proxy)
{
#if GLIB_VERSION_MAX_ALLOWED >= GLIB_VERSION_2_38
  proxy->priv = greetable_proxy_get_instance_private (proxy);
#else
  proxy->priv = G_TYPE_INSTANCE_GET_PRIVATE (proxy, TYPE_GREETABLE_PROXY, GreetableProxyPrivate);
#endif

  g_dbus_proxy_set_interface_info (G_DBUS_PROXY (proxy), greetable_interface_info ());
}